

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnTable
          (BinaryReaderIR *this,Index index,Type elem_type,Limits *elem_limits)

{
  char *__s;
  Offset OVar1;
  uint64_t uVar2;
  undefined1 local_60 [8];
  Location loc;
  _Head_base<0UL,_wabt::TableModuleField_*,_false> local_38;
  
  __s = this->filename_;
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc.field_1.field_0.line = 0;
  loc.filename.data_ = (char *)strlen(__s);
  local_60 = (undefined1  [8])__s;
  loc.filename.size_ = OVar1;
  MakeUnique<wabt::TableModuleField,wabt::Location>
            ((wabt *)(loc.field_1.field2 + 8),(Location *)local_60);
  *(undefined2 *)(loc.field_1._8_8_ + 0x70) = *(undefined2 *)&elem_limits->has_max;
  uVar2 = elem_limits->max;
  *(uint64_t *)(loc.field_1._8_8_ + 0x60) = elem_limits->initial;
  *(uint64_t *)(loc.field_1._8_8_ + 0x68) = uVar2;
  local_38._M_head_impl = (TableModuleField *)loc.field_1._8_8_;
  loc.field_1._8_8_ = 0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                       *)&local_38);
  if (local_38._M_head_impl != (TableModuleField *)0x0) {
    (*((local_38._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_38._M_head_impl = (TableModuleField *)0x0;
  if (loc.field_1._8_8_ != 0) {
    (**(code **)(*(long *)loc.field_1._8_8_ + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnTable(Index index,
                               Type elem_type,
                               const Limits* elem_limits) {
  auto field = MakeUnique<TableModuleField>(GetLocation());
  Table& table = field->table;
  table.elem_limits = *elem_limits;
  module_->AppendField(std::move(field));
  return Result::Ok;
}